

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

String * __thiscall
Diligent::GetShaderCodeBufferDescString_abi_cxx11_
          (String *__return_storage_ptr__,Diligent *this,ShaderCodeBufferDesc *Desc,
          size_t GlobalIdent,size_t MemberIdent)

{
  _Setw _Var1;
  ostream *poVar2;
  void *pvVar3;
  stringstream local_1b0 [8];
  stringstream ss;
  ostream local_1a0 [376];
  size_t local_28;
  size_t MemberIdent_local;
  size_t GlobalIdent_local;
  ShaderCodeBufferDesc *Desc_local;
  
  local_28 = GlobalIdent;
  MemberIdent_local = (size_t)Desc;
  GlobalIdent_local = (size_t)this;
  Desc_local = (ShaderCodeBufferDesc *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b0);
  _Var1 = std::setw((int)MemberIdent_local);
  poVar2 = std::operator<<(local_1a0,_Var1);
  poVar2 = std::operator<<(poVar2,' ');
  poVar2 = std::operator<<(poVar2,"Size: ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,*(uint *)GlobalIdent_local);
  poVar2 = (ostream *)std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  _Var1 = std::setw((int)MemberIdent_local);
  poVar2 = std::operator<<(poVar2,_Var1);
  poVar2 = std::operator<<(poVar2,' ');
  poVar2 = std::operator<<(poVar2,"Vars: ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,*(uint *)(GlobalIdent_local + 4));
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  PrintShaderCodeVariables
            ((stringstream *)local_1b0,MemberIdent_local + local_28,local_28,
             *(ShaderCodeVariableDesc **)(GlobalIdent_local + 8),*(Uint32 *)(GlobalIdent_local + 4))
  ;
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

String GetShaderCodeBufferDescString(const ShaderCodeBufferDesc& Desc, size_t GlobalIdent, size_t MemberIdent)
{
    std::stringstream ss;
    ss << std::setw(static_cast<int>(GlobalIdent)) << ' ' << "Size: " << Desc.Size << std::endl
       << std::setw(static_cast<int>(GlobalIdent)) << ' ' << "Vars: " << Desc.NumVariables << std::endl;
    PrintShaderCodeVariables(ss, GlobalIdent + MemberIdent, MemberIdent, Desc.pVariables, Desc.NumVariables);

    return ss.str();
}